

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O1

bool tinyusdz::anon_unknown_160::ExtractVariantsRec
               (uint32_t depth,string *root_path,PrimSpec *ps,Dictionary *dict,uint32_t max_depth,
               string *err)

{
  pointer pcVar1;
  PrimSpec *pPVar2;
  bool bVar3;
  long *plVar4;
  mapped_type *pmVar5;
  _Rb_tree_node_base *p_Var6;
  size_type *psVar7;
  uint32_t depth_00;
  undefined4 in_register_00000084;
  char *pcVar8;
  uint32_t max_depth_00;
  PrimSpec *ps_00;
  bool bVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string full_prim_path;
  Dictionary variantInfos;
  Dictionary values;
  storage_union local_148;
  vtable_type *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  undefined8 local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  Dictionary *local_110;
  uint32_t local_104;
  PrimSpec *local_100;
  char *local_f8;
  storage_union local_f0;
  undefined **local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  undefined8 local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  key_type local_b8;
  _Rb_tree_node_base *local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  local_60;
  
  pcVar8 = (char *)CONCAT44(in_register_00000084,max_depth);
  local_110 = dict;
  local_104 = depth;
  if (depth < 0x100001) {
    local_90._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_90._M_impl.super__Rb_tree_header._M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right =
         local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((ps->_name)._M_string_length == 0) {
      if (pcVar8 != (char *)0x0) {
        ::std::__cxx11::string::append(pcVar8);
      }
      bVar9 = false;
    }
    else {
      pcVar1 = (root_path->_M_dataplus)._M_p;
      local_148.dynamic = &local_138;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_148,pcVar1,pcVar1 + root_path->_M_string_length);
      ::std::__cxx11::string::append((char *)&local_148);
      plVar4 = (long *)::std::__cxx11::string::_M_append
                                 ((char *)&local_148,(ulong)(ps->_name)._M_dataplus._M_p);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_b8.field_2._M_allocated_capacity = *psVar7;
        local_b8.field_2._8_8_ = plVar4[3];
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar7;
        local_b8._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_b8._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((vtable_type **)local_148.dynamic != &local_138) {
        operator_delete(local_148.dynamic,(ulong)((long)&local_138->type_id + 1));
      }
      local_100 = ps;
      local_f8 = pcVar8;
      if ((ps->_metas).variantSets.has_value_ == true) {
        local_138 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
        local_148.dynamic = (vtable_type **)0x0;
        local_128 = 0;
        local_120._M_local_buf[0] = '\0';
        local_130 = &local_120;
        MetaVariable::
        set_value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((MetaVariable *)&local_148,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&(ps->_metas).variantSets.contained + 8));
        local_f0.dynamic = &local_e0;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"variantSets","");
        pmVar5 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                               *)&local_90,(key_type *)&local_f0);
        ::std::__cxx11::string::_M_assign((string *)&pmVar5->_name);
        linb::any::operator=((any *)pmVar5,(any *)&local_148);
        if ((undefined ***)local_f0.dynamic != &local_e0) {
          operator_delete(local_f0.dynamic,(long)local_e0 + 1);
        }
        if (local_130 != &local_120) {
          operator_delete(local_130,
                          CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0])
                          + 1);
        }
        pcVar8 = local_f8;
        ps = local_100;
        if (local_138 != (vtable_type *)0x0) {
          (*local_138->destroy)(&local_148);
          local_138 = (vtable_type *)0x0;
        }
      }
      max_depth_00 = (uint32_t)pcVar8;
      if ((ps->_metas).variants.has_value_ == true) {
        local_60._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_60._M_impl.super__Rb_tree_header._M_header;
        local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
        p_Var6 = *(_Rb_tree_node_base **)((long)&(ps->_metas).variants.contained + 0x18);
        local_98 = (_Rb_tree_node_base *)((long)&(ps->_metas).variants.contained + 8);
        local_60._M_impl.super__Rb_tree_header._M_header._M_right =
             local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        if (p_Var6 != local_98) {
          do {
            local_138 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_148.dynamic = (void *)0x0;
            local_128 = 0;
            local_120._M_local_buf[0] = '\0';
            local_130 = &local_120;
            MetaVariable::set_value<std::__cxx11::string>
                      ((MetaVariable *)&local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var6 + 2));
            local_e0 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_f0.dynamic = (undefined ***)0x0;
            local_d0 = 0;
            local_c8._M_local_buf[0] = '\0';
            local_d8 = &local_c8;
            MetaVariable::set_value<std::__cxx11::string>
                      ((MetaVariable *)&local_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var6 + 2));
            pmVar5 = ::std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                   *)&local_60,(key_type *)(p_Var6 + 1));
            ::std::__cxx11::string::_M_assign((string *)&pmVar5->_name);
            linb::any::operator=((any *)pmVar5,(any *)&local_f0);
            if (local_d8 != &local_c8) {
              operator_delete(local_d8,CONCAT71(local_c8._M_allocated_capacity._1_7_,
                                                local_c8._M_local_buf[0]) + 1);
            }
            if (local_e0 != (undefined **)0x0) {
              (*(code *)local_e0[4])(&local_f0);
              local_e0 = (undefined **)0x0;
            }
            if (local_130 != &local_120) {
              operator_delete(local_130,
                              CONCAT71(local_120._M_allocated_capacity._1_7_,
                                       local_120._M_local_buf[0]) + 1);
            }
            if (local_138 != (vtable_type *)0x0) {
              (*local_138->destroy)(&local_148);
              local_138 = (vtable_type *)0x0;
            }
            p_Var6 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var6);
          } while (p_Var6 != local_98);
        }
        local_138 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
        local_148.dynamic = (vtable_type **)0x0;
        local_128 = 0;
        local_120._M_local_buf[0] = '\0';
        local_130 = &local_120;
        MetaVariable::
        set_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                  ((MetaVariable *)&local_148,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                    *)&local_60);
        local_f0.dynamic = &local_e0;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"variants","");
        pmVar5 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                               *)&local_90,(key_type *)&local_f0);
        ::std::__cxx11::string::_M_assign((string *)&pmVar5->_name);
        linb::any::operator=((any *)pmVar5,(any *)&local_148);
        if ((undefined ***)local_f0.dynamic != &local_e0) {
          operator_delete(local_f0.dynamic,(long)local_e0 + 1);
        }
        ps = local_100;
        if (local_130 != &local_120) {
          operator_delete(local_130,
                          CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0])
                          + 1);
        }
        max_depth_00 = (uint32_t)local_f8;
        if (local_138 != (vtable_type *)0x0) {
          (*local_138->destroy)(&local_148);
          local_138 = (vtable_type *)0x0;
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
        ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent)
        ;
      }
      if (local_90._M_impl.super__Rb_tree_header._M_node_count != 0) {
        local_138 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
        local_148.dynamic = (vtable_type **)0x0;
        local_128 = 0;
        local_120._M_local_buf[0] = '\0';
        local_130 = &local_120;
        MetaVariable::
        set_value<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                  ((MetaVariable *)&local_148,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                    *)&local_90);
        pmVar5 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                 ::operator[](local_110,&local_b8);
        ::std::__cxx11::string::_M_assign((string *)&pmVar5->_name);
        linb::any::operator=((any *)pmVar5,(any *)&local_148);
        if (local_130 != &local_120) {
          operator_delete(local_130,
                          CONCAT71(local_120._M_allocated_capacity._1_7_,local_120._M_local_buf[0])
                          + 1);
        }
        if (local_138 != (vtable_type *)0x0) {
          (*local_138->destroy)(&local_148);
          local_138 = (vtable_type *)0x0;
        }
      }
      ps_00 = (ps->_children).
              super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
              super__Vector_impl_data._M_start;
      pPVar2 = (ps->_children).
               super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
               super__Vector_impl_data._M_finish;
      bVar9 = ps_00 == pPVar2;
      if (!bVar9) {
        depth_00 = local_104 + 1;
        bVar3 = ExtractVariantsRec(depth_00,&local_b8,ps_00,local_110,max_depth_00,err);
        if (bVar3) {
          do {
            ps_00 = ps_00 + 1;
            bVar9 = ps_00 == pPVar2;
            if (bVar9) break;
            bVar3 = ExtractVariantsRec(depth_00,&local_b8,ps_00,local_110,max_depth_00,err);
          } while (bVar3);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
    ::_M_erase(&local_90,(_Link_type)local_90._M_impl.super__Rb_tree_header._M_header._M_parent);
  }
  else {
    if (pcVar8 != (char *)0x0) {
      ::std::__cxx11::string::append(pcVar8);
    }
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool ExtractVariantsRec(uint32_t depth, const std::string &root_path,
                        const PrimSpec &ps, Dictionary &dict,
                        const uint32_t max_depth, std::string *err) {
  if (depth > max_depth) {
    if (err) {
      (*err) += "Too deep\n";
    }
    return false;
  }

  Dictionary variantInfos;

  if (ps.name().empty()) {
    if (err) {
      (*err) += "PrimSpec name is empty.\n";
    }
    return false;
  }

  std::string full_prim_path = root_path + "/" + ps.name();

  if (ps.metas().variantSets) {
    const std::vector<std::string> &vsets =
        ps.metas().variantSets.value().second;
    MetaVariable var;
    var.set_value(vsets);
    variantInfos["variantSets"] = var;
  }

  if (ps.metas().variants) {
    Dictionary values;

    const VariantSelectionMap &vsmap = ps.metas().variants.value();
    for (const auto &item : vsmap) {
      MetaVariable var;
      var.set_value(item.second);

      values[item.first] = item.second;
    }

    variantInfos["variants"] = values;
  }

  if (variantInfos.size()) {
    dict[full_prim_path] = variantInfos;
  }

  // Traverse children
  for (const auto &child : ps.children()) {
    if (!ExtractVariantsRec(depth + 1, full_prim_path, child, dict, max_depth,
                            err)) {
      return false;
    }
  }

  return true;
}